

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-test.c++
# Opt level: O2

Promise<void> __thiscall
capnp::_::anon_unknown_0::TestGateway::export_(TestGateway *this,ExportContext context)

{
  TransformPromiseNodeBase *this_00;
  size_t in_RCX;
  CallContextHook *in_RDX;
  void *__buf;
  PromiseNode *extraout_RDX;
  int in_R8D;
  Promise<void> PVar1;
  ExportContext context_local;
  Own<kj::_::PromiseNode> local_d8;
  Client cap;
  Request<capnp::Persistent<capnproto_test::capnp::test::TestSturdyRef,_capnp::AnyPointer>::SaveParams,_capnp::Persistent<capnproto_test::capnp::test::TestSturdyRef,_capnp::AnyPointer>::SaveResults>
  local_b0;
  Request<capnp::Persistent<capnproto_test::capnp::test::TestSturdyRef,_capnp::AnyPointer>::SaveParams,_capnp::Persistent<capnproto_test::capnp::test::TestSturdyRef,_capnp::AnyPointer>::SaveResults>
  local_78;
  Own<kj::_::PromiseNode> local_40;
  Maybe<capnp::MessageSize> local_30;
  
  context_local.hook = in_RDX;
  CallContext<capnp::RealmGateway<capnproto_test::capnp::test::TestSturdyRef,_capnp::Text,_capnp::AnyPointer,_capnp::AnyPointer>::ExportParams,_capnp::Persistent<capnp::Text,_capnp::AnyPointer>::SaveResults>
  ::getParams((Reader *)&local_b0,&context_local);
  RealmGateway<capnproto_test::capnp::test::TestSturdyRef,_capnp::Text,_capnp::AnyPointer,_capnp::AnyPointer>
  ::ExportParams::Reader::getCap(&cap,(Reader *)&local_b0);
  (*(context_local.hook)->_vptr_CallContextHook[1])();
  local_30.ptr.isSet = false;
  Persistent<capnproto_test::capnp::test::TestSturdyRef,_capnp::AnyPointer>::Client::saveRequest
            (&local_78,&cap,&local_30);
  Request<capnp::Persistent<capnproto_test::capnp::test::TestSturdyRef,_capnp::AnyPointer>::SaveParams,_capnp::Persistent<capnproto_test::capnp::test::TestSturdyRef,_capnp::AnyPointer>::SaveResults>
  ::send(&local_b0,(int)&local_78,__buf,in_RCX,in_R8D);
  this_00 = (TransformPromiseNodeBase *)operator_new(0x30);
  kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
            (this_00,(Own<kj::_::PromiseNode> *)&local_b0,
             kj::_::
             TransformPromiseNode<kj::_::Void,_capnp::Response<capnp::Persistent<capnproto_test::capnp::test::TestSturdyRef,_capnp::AnyPointer>::SaveResults>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-test.c++:1087:15),_kj::_::PropagateException>
             ::anon_class_8_1_bc11688f_for_func::operator());
  (this_00->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_0065dff0;
  this_00[1].super_PromiseNode._vptr_PromiseNode = (_func_int **)context_local.hook;
  local_d8.disposer =
       (Disposer *)
       &kj::_::
        HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,capnp::Response<capnp::Persistent<capnproto_test::capnp::test::TestSturdyRef,capnp::AnyPointer>::SaveResults>,capnp::_::(anonymous_namespace)::TestGateway::export_(capnp::CallContext<capnp::RealmGateway<capnproto_test::capnp::test::TestSturdyRef,capnp::Text,capnp::AnyPointer,capnp::AnyPointer>::ExportParams,capnp::Persistent<capnp::Text,capnp::AnyPointer>::SaveResults>)::{lambda(capnp::Response<capnp::Persistent<capnproto_test::capnp::test::TestSturdyRef,capnp::AnyPointer>::SaveResults>)#1},kj::_::PropagateException>>
        ::instance;
  local_40.disposer =
       (Disposer *)
       &kj::_::
        HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,capnp::Response<capnp::Persistent<capnproto_test::capnp::test::TestSturdyRef,capnp::AnyPointer>::SaveResults>,capnp::_::(anonymous_namespace)::TestGateway::export_(capnp::CallContext<capnp::RealmGateway<capnproto_test::capnp::test::TestSturdyRef,capnp::Text,capnp::AnyPointer,capnp::AnyPointer>::ExportParams,capnp::Persistent<capnp::Text,capnp::AnyPointer>::SaveResults>)::{lambda(capnp::Response<capnp::Persistent<capnproto_test::capnp::test::TestSturdyRef,capnp::AnyPointer>::SaveResults>)#1},kj::_::PropagateException>>
        ::instance;
  local_d8.ptr = (PromiseNode *)0x0;
  (this->super_Server)._vptr_Server =
       (_func_int **)
       &kj::_::
        HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,capnp::Response<capnp::Persistent<capnproto_test::capnp::test::TestSturdyRef,capnp::AnyPointer>::SaveResults>,capnp::_::(anonymous_namespace)::TestGateway::export_(capnp::CallContext<capnp::RealmGateway<capnproto_test::capnp::test::TestSturdyRef,capnp::Text,capnp::AnyPointer,capnp::AnyPointer>::ExportParams,capnp::Persistent<capnp::Text,capnp::AnyPointer>::SaveResults>)::{lambda(capnp::Response<capnp::Persistent<capnproto_test::capnp::test::TestSturdyRef,capnp::AnyPointer>::SaveResults>)#1},kj::_::PropagateException>>
        ::instance;
  *(TransformPromiseNodeBase **)&(this->super_Server).field_0x8 = this_00;
  local_40.ptr = (PromiseNode *)0x0;
  kj::Own<kj::_::PromiseNode>::dispose(&local_40);
  kj::Own<kj::_::PromiseNode>::dispose(&local_d8);
  RemotePromise<capnp::Persistent<capnproto_test::capnp::test::TestSturdyRef,_capnp::AnyPointer>::SaveResults>
  ::~RemotePromise((RemotePromise<capnp::Persistent<capnproto_test::capnp::test::TestSturdyRef,_capnp::AnyPointer>::SaveResults>
                    *)&local_b0);
  kj::Own<capnp::RequestHook>::dispose(&local_78.hook);
  kj::Own<capnp::ClientHook>::dispose((Own<capnp::ClientHook> *)&cap.field_0x8);
  PVar1.super_PromiseBase.node.ptr = extraout_RDX;
  PVar1.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<void>)PVar1.super_PromiseBase.node;
}

Assistant:

kj::Promise<void> export_(ExportContext context) override {
    auto cap = context.getParams().getCap();
    context.releaseParams();
    return cap.saveRequest().send()
        .then([KJ_CPCAP(context)]
            (Response<Persistent<test::TestSturdyRef>::SaveResults> response) mutable {
      context.getResults().setSturdyRef(kj::str("exported-",
          response.getSturdyRef().getObjectId().getAs<Text>()));
    });
  }